

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScsServer.cpp
# Opt level: O0

ServerPtr __thiscall Scs::CreateServer(Scs *this,ServerParams *params)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ServerPtr SVar1;
  undefined1 local_29;
  shared_ptr<Scs::Server> local_28;
  ServerParams *local_18;
  ServerParams *params_local;
  
  local_18 = params;
  params_local = (ServerParams *)this;
  Allocator<Scs::Server>::Allocator((Allocator<Scs::Server> *)&local_29);
  std::allocate_shared<Scs::Server,Scs::Allocator<Scs::Server>,Scs::ServerParams_const&>
            ((Allocator<Scs::Server> *)&local_28,(ServerParams *)&local_29);
  std::shared_ptr<Scs::IServer>::shared_ptr<Scs::Server,void>
            ((shared_ptr<Scs::IServer> *)this,&local_28);
  std::shared_ptr<Scs::Server>::~shared_ptr(&local_28);
  Allocator<Scs::Server>::~Allocator((Allocator<Scs::Server> *)&local_29);
  SVar1.super___shared_ptr<Scs::IServer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  SVar1.super___shared_ptr<Scs::IServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ServerPtr)SVar1.super___shared_ptr<Scs::IServer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ServerPtr Scs::CreateServer(const ServerParams & params)
{
	return std::allocate_shared<Server>(Allocator<Server>(), params);
}